

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateFunctionMapFactory.cpp
# Opt level: O2

ElementFunctionMap *
COLLADASaxFWL15::FunctionMapFactory::createFunctionMap__library_animations__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  
  if (createFunctionMap__library_animations__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_animations__allChildren()::functionMap);
    if (iVar1 != 0) {
      createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_animations__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_animations__allChildren::functionMap,
                   &__dso_handle);
      __cxa_guard_release(&createFunctionMap__library_animations__allChildren()::functionMap);
    }
  }
  if (createFunctionMap__library_animations__allChildren()::mapFilled == '\0') {
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_COLLADA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__COLLADA;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__COLLADA;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATIONS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_animations;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_animations;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_animations;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_animations;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_animations;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_animations;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ANIMATION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__animation;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__animation;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__animation;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__animation;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__animation;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__animation;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ANIMATION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__animation;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__animation;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__animation;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__animation;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__animation;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__animation;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_CHANNEL);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__channel;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__channel;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__channel;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__channel;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__channel;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__channel;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__sampler;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__sampler;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__sampler;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__sampler;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__sampler;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__sampler;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_CHANNEL);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__channel;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__channel;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__channel;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__channel;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__channel;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__channel;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SAMPLER);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__sampler;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__sampler;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__sampler;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__sampler;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__sampler;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__sampler;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_CONTRIBUTOR);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__contributor;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__contributor;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__contributor;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__contributor;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__contributor;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__contributor;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_COVERAGE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__coverage
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__coverage;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__coverage;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__coverage;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__coverage;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__coverage;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_CREATED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__created;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__created;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__created;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__created;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__created;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__created;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_EMAIL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_email;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_email;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_email;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_email;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_email;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_email;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_WEBSITE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_website;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_website;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_website
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_website;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_website;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_website;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHORING_TOOL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__authoring_tool
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_COMMENTS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__comments
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__comments;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__comments;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__comments;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__comments;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__comments;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_COPYRIGHT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__copyright;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__copyright;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__copyright;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__copyright;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__copyright;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__copyright;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_DATA);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source_data;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source_data;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source_data;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source_data;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source_data;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source_data;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_GEOGRAPHIC_LOCATION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__geographic_location;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__geographic_location;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__geographic_location;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__geographic_location;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__geographic_location;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__geographic_location;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ALTITUDE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__altitude
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__altitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__altitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__altitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__altitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__altitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_LATITUDE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__latitude
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__latitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__latitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__latitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__latitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__latitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_LONGITUDE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__longitude;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__longitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__longitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__longitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__longitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__longitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_IDREF_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_NAME_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__Name_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__Name_array
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__Name_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__Name_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__Name_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__Name_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SIDREF_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_BOOL_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__bool_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__bool_array
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__bool_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__bool_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__bool_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__bool_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_FLOAT_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__float_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__float_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__float_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__float_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__float_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__float_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_INT_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__int_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__int_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__int_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__int_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__int_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__int_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_TYPE____TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source_type____technique_common
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_TOKEN_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__token_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__token_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__token_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__token_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__token_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__token_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_ACCESSOR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__accessor
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__accessor;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__accessor;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__accessor;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__accessor;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__accessor;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_animations__allChildren::functionMap,
                          &HASH_ELEMENT_PARAM____PARAM_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__param____param_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__param____param_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__param____param_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__param____param_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__param____param_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__param____param_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    createFunctionMap__library_animations__allChildren()::mapFilled = '\x01';
  }
  return &createFunctionMap__library_animations__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen15Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_animations__allChildren() {
static ColladaParserAutoGen15Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__COLLADA, &ColladaParserAutoGen15Private::_data__COLLADA, &ColladaParserAutoGen15Private::_end__COLLADA, &ColladaParserAutoGen15Private::_preBegin__COLLADA, &ColladaParserAutoGen15Private::_preEnd__COLLADA, &ColladaParserAutoGen15Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATIONS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_animations, &ColladaParserAutoGen15Private::_data__library_animations, &ColladaParserAutoGen15Private::_end__library_animations, &ColladaParserAutoGen15Private::_preBegin__library_animations, &ColladaParserAutoGen15Private::_preEnd__library_animations, &ColladaParserAutoGen15Private::_freeAttributes__library_animations);
functionMap[HASH_ELEMENT_ANIMATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__animation, &ColladaParserAutoGen15Private::_data__animation, &ColladaParserAutoGen15Private::_end__animation, &ColladaParserAutoGen15Private::_preBegin__animation, &ColladaParserAutoGen15Private::_preEnd__animation, &ColladaParserAutoGen15Private::_freeAttributes__animation);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_ANIMATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__animation, &ColladaParserAutoGen15Private::_data__animation, &ColladaParserAutoGen15Private::_end__animation, &ColladaParserAutoGen15Private::_preBegin__animation, &ColladaParserAutoGen15Private::_preEnd__animation, &ColladaParserAutoGen15Private::_freeAttributes__animation);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_CHANNEL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__channel, &ColladaParserAutoGen15Private::_data__channel, &ColladaParserAutoGen15Private::_end__channel, &ColladaParserAutoGen15Private::_preBegin__channel, &ColladaParserAutoGen15Private::_preEnd__channel, &ColladaParserAutoGen15Private::_freeAttributes__channel);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SAMPLER] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__sampler, &ColladaParserAutoGen15Private::_data__sampler, &ColladaParserAutoGen15Private::_end__sampler, &ColladaParserAutoGen15Private::_preBegin__sampler, &ColladaParserAutoGen15Private::_preEnd__sampler, &ColladaParserAutoGen15Private::_freeAttributes__sampler);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_CHANNEL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__channel, &ColladaParserAutoGen15Private::_data__channel, &ColladaParserAutoGen15Private::_end__channel, &ColladaParserAutoGen15Private::_preBegin__channel, &ColladaParserAutoGen15Private::_preEnd__channel, &ColladaParserAutoGen15Private::_freeAttributes__channel);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SAMPLER] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__sampler, &ColladaParserAutoGen15Private::_data__sampler, &ColladaParserAutoGen15Private::_end__sampler, &ColladaParserAutoGen15Private::_preBegin__sampler, &ColladaParserAutoGen15Private::_preEnd__sampler, &ColladaParserAutoGen15Private::_freeAttributes__sampler);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__contributor, &ColladaParserAutoGen15Private::_data__contributor, &ColladaParserAutoGen15Private::_end__contributor, &ColladaParserAutoGen15Private::_preBegin__contributor, &ColladaParserAutoGen15Private::_preEnd__contributor, &ColladaParserAutoGen15Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_COVERAGE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__coverage, &ColladaParserAutoGen15Private::_data__coverage, &ColladaParserAutoGen15Private::_end__coverage, &ColladaParserAutoGen15Private::_preBegin__coverage, &ColladaParserAutoGen15Private::_preEnd__coverage, &ColladaParserAutoGen15Private::_freeAttributes__coverage);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__created, &ColladaParserAutoGen15Private::_data__created, &ColladaParserAutoGen15Private::_end__created, &ColladaParserAutoGen15Private::_preBegin__created, &ColladaParserAutoGen15Private::_preEnd__created, &ColladaParserAutoGen15Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author, &ColladaParserAutoGen15Private::_data__author, &ColladaParserAutoGen15Private::_end__author, &ColladaParserAutoGen15Private::_preBegin__author, &ColladaParserAutoGen15Private::_preEnd__author, &ColladaParserAutoGen15Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHOR_EMAIL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_email, &ColladaParserAutoGen15Private::_data__author_email, &ColladaParserAutoGen15Private::_end__author_email, &ColladaParserAutoGen15Private::_preBegin__author_email, &ColladaParserAutoGen15Private::_preEnd__author_email, &ColladaParserAutoGen15Private::_freeAttributes__author_email);
functionMap[HASH_ELEMENT_AUTHOR_WEBSITE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_website, &ColladaParserAutoGen15Private::_data__author_website, &ColladaParserAutoGen15Private::_end__author_website, &ColladaParserAutoGen15Private::_preBegin__author_website, &ColladaParserAutoGen15Private::_preEnd__author_website, &ColladaParserAutoGen15Private::_freeAttributes__author_website);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__authoring_tool, &ColladaParserAutoGen15Private::_data__authoring_tool, &ColladaParserAutoGen15Private::_end__authoring_tool, &ColladaParserAutoGen15Private::_preBegin__authoring_tool, &ColladaParserAutoGen15Private::_preEnd__authoring_tool, &ColladaParserAutoGen15Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__comments, &ColladaParserAutoGen15Private::_data__comments, &ColladaParserAutoGen15Private::_end__comments, &ColladaParserAutoGen15Private::_preBegin__comments, &ColladaParserAutoGen15Private::_preEnd__comments, &ColladaParserAutoGen15Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__copyright, &ColladaParserAutoGen15Private::_data__copyright, &ColladaParserAutoGen15Private::_end__copyright, &ColladaParserAutoGen15Private::_preBegin__copyright, &ColladaParserAutoGen15Private::_preEnd__copyright, &ColladaParserAutoGen15Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_data, &ColladaParserAutoGen15Private::_data__source_data, &ColladaParserAutoGen15Private::_end__source_data, &ColladaParserAutoGen15Private::_preBegin__source_data, &ColladaParserAutoGen15Private::_preEnd__source_data, &ColladaParserAutoGen15Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_GEOGRAPHIC_LOCATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__geographic_location, &ColladaParserAutoGen15Private::_data__geographic_location, &ColladaParserAutoGen15Private::_end__geographic_location, &ColladaParserAutoGen15Private::_preBegin__geographic_location, &ColladaParserAutoGen15Private::_preEnd__geographic_location, &ColladaParserAutoGen15Private::_freeAttributes__geographic_location);
functionMap[HASH_ELEMENT_ALTITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__altitude, &ColladaParserAutoGen15Private::_data__altitude, &ColladaParserAutoGen15Private::_end__altitude, &ColladaParserAutoGen15Private::_preBegin__altitude, &ColladaParserAutoGen15Private::_preEnd__altitude, &ColladaParserAutoGen15Private::_freeAttributes__altitude);
functionMap[HASH_ELEMENT_LATITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__latitude, &ColladaParserAutoGen15Private::_data__latitude, &ColladaParserAutoGen15Private::_end__latitude, &ColladaParserAutoGen15Private::_preBegin__latitude, &ColladaParserAutoGen15Private::_preEnd__latitude, &ColladaParserAutoGen15Private::_freeAttributes__latitude);
functionMap[HASH_ELEMENT_LONGITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__longitude, &ColladaParserAutoGen15Private::_data__longitude, &ColladaParserAutoGen15Private::_end__longitude, &ColladaParserAutoGen15Private::_preBegin__longitude, &ColladaParserAutoGen15Private::_preEnd__longitude, &ColladaParserAutoGen15Private::_freeAttributes__longitude);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_type, &ColladaParserAutoGen15Private::_data__input____input_local_type, &ColladaParserAutoGen15Private::_end__input____input_local_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type);
functionMap[HASH_ELEMENT_IDREF_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__IDREF_array, &ColladaParserAutoGen15Private::_data__IDREF_array, &ColladaParserAutoGen15Private::_end__IDREF_array, &ColladaParserAutoGen15Private::_preBegin__IDREF_array, &ColladaParserAutoGen15Private::_preEnd__IDREF_array, &ColladaParserAutoGen15Private::_freeAttributes__IDREF_array);
functionMap[HASH_ELEMENT_NAME_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__Name_array, &ColladaParserAutoGen15Private::_data__Name_array, &ColladaParserAutoGen15Private::_end__Name_array, &ColladaParserAutoGen15Private::_preBegin__Name_array, &ColladaParserAutoGen15Private::_preEnd__Name_array, &ColladaParserAutoGen15Private::_freeAttributes__Name_array);
functionMap[HASH_ELEMENT_SIDREF_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__SIDREF_array, &ColladaParserAutoGen15Private::_data__SIDREF_array, &ColladaParserAutoGen15Private::_end__SIDREF_array, &ColladaParserAutoGen15Private::_preBegin__SIDREF_array, &ColladaParserAutoGen15Private::_preEnd__SIDREF_array, &ColladaParserAutoGen15Private::_freeAttributes__SIDREF_array);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_BOOL_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bool_array, &ColladaParserAutoGen15Private::_data__bool_array, &ColladaParserAutoGen15Private::_end__bool_array, &ColladaParserAutoGen15Private::_preBegin__bool_array, &ColladaParserAutoGen15Private::_preEnd__bool_array, &ColladaParserAutoGen15Private::_freeAttributes__bool_array);
functionMap[HASH_ELEMENT_FLOAT_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__float_array, &ColladaParserAutoGen15Private::_data__float_array, &ColladaParserAutoGen15Private::_end__float_array, &ColladaParserAutoGen15Private::_preBegin__float_array, &ColladaParserAutoGen15Private::_preEnd__float_array, &ColladaParserAutoGen15Private::_freeAttributes__float_array);
functionMap[HASH_ELEMENT_INT_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__int_array, &ColladaParserAutoGen15Private::_data__int_array, &ColladaParserAutoGen15Private::_end__int_array, &ColladaParserAutoGen15Private::_preBegin__int_array, &ColladaParserAutoGen15Private::_preEnd__int_array, &ColladaParserAutoGen15Private::_freeAttributes__int_array);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_SOURCE_TYPE____TECHNIQUE_COMMON] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_type____technique_common, &ColladaParserAutoGen15Private::_data__source_type____technique_common, &ColladaParserAutoGen15Private::_end__source_type____technique_common, &ColladaParserAutoGen15Private::_preBegin__source_type____technique_common, &ColladaParserAutoGen15Private::_preEnd__source_type____technique_common, &ColladaParserAutoGen15Private::_freeAttributes__source_type____technique_common);
functionMap[HASH_ELEMENT_TOKEN_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__token_array, &ColladaParserAutoGen15Private::_data__token_array, &ColladaParserAutoGen15Private::_end__token_array, &ColladaParserAutoGen15Private::_preBegin__token_array, &ColladaParserAutoGen15Private::_preEnd__token_array, &ColladaParserAutoGen15Private::_freeAttributes__token_array);
functionMap[HASH_ELEMENT_ACCESSOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__accessor, &ColladaParserAutoGen15Private::_data__accessor, &ColladaParserAutoGen15Private::_end__accessor, &ColladaParserAutoGen15Private::_preBegin__accessor, &ColladaParserAutoGen15Private::_preEnd__accessor, &ColladaParserAutoGen15Private::_freeAttributes__accessor);
functionMap[HASH_ELEMENT_PARAM____PARAM_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__param____param_type, &ColladaParserAutoGen15Private::_data__param____param_type, &ColladaParserAutoGen15Private::_end__param____param_type, &ColladaParserAutoGen15Private::_preBegin__param____param_type, &ColladaParserAutoGen15Private::_preEnd__param____param_type, &ColladaParserAutoGen15Private::_freeAttributes__param____param_type);
mapFilled = true;
}
return functionMap;
}